

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType position;
  PositionType PVar3;
  bool bVar4;
  ReferenceType pSVar5;
  PointerType pSVar6;
  PointerType pSVar7;
  iterator iVar8;
  iterator iVar9;
  cmLinkedTree<cmDefinitions> *local_160;
  PositionType local_158;
  iterator origin;
  SnapshotDataType local_130;
  cmLinkedTree<cmState::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_30 [8];
  PositionType pos;
  long entryPointLine_local;
  string *entryPointCommand_local;
  cmState *this_local;
  
  local_48 = originSnapshot.Position.Tree;
  PStack_40 = originSnapshot.Position.Position;
  pos.Position = entryPointLine;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType(&local_130,pSVar5);
  iVar8.Position = PStack_40;
  iVar8.Tree = local_48;
  iVar8 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,iVar8,&local_130);
  pos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)iVar8.Position;
  local_30 = (undefined1  [8])iVar8.Tree;
  SnapshotDataType::~SnapshotDataType(&local_130);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  PVar3 = pos.Position;
  (pSVar6->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar6->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar6->EntryPointLine = PVar3;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  std::__cxx11::string::operator=((string *)&pSVar6->EntryPointCommand,(string *)entryPointCommand);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar6->SnapshotType = VariableScopeType;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar7->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar7->PolicyScope).Position = (pSVar6->Policies).Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  bVar4 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (!bVar4) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x3c6,
                  "cmState::Snapshot cmState::CreateVariableScopeSnapshot(cmState::Snapshot, const std::string &, long)"
                 );
  }
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pcVar1 = (pSVar6->Vars).Tree;
  PVar2 = (pSVar6->Vars).Position;
  iVar9 = pSVar6->Vars;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar6->Parent).Tree = pcVar1;
  (pSVar6->Parent).Position = PVar2;
  iVar9 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar9);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  local_160 = iVar9.Tree;
  (pSVar6->Vars).Tree = local_160;
  local_158 = iVar9.Position;
  (pSVar6->Vars).Position = local_158;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  bVar4 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (!bVar4) {
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x3cc,
                  "cmState::Snapshot cmState::CreateVariableScopeSnapshot(cmState::Snapshot, const std::string &, long)"
                 );
  }
  position.Position = (PositionType)pos.Tree;
  position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_30;
  Snapshot::Snapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateVariableScopeSnapshot(cmState::Snapshot originSnapshot,
                                     std::string const& entryPointCommand,
                                     long entryPointLine)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = VariableScopeType;
  pos->Keep = false;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return cmState::Snapshot(this, pos);
}